

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

GLint impl_GLSL_GetAttribLocation(MOJOSHADER_glProgram *program,int idx)

{
  GLint GVar1;
  PFNGLGETATTRIBLOCATIONPROC *pp_Var2;
  
  pp_Var2 = &ctx->glGetAttribLocation;
  if (ctx->have_opengl_2 == 0) {
    pp_Var2 = (PFNGLGETATTRIBLOCATIONPROC *)&ctx->glGetAttribLocationARB;
  }
  GVar1 = (**pp_Var2)(program->handle,program->vertex->parseData->attributes[idx].name);
  return GVar1;
}

Assistant:

static GLint impl_GLSL_GetAttribLocation(MOJOSHADER_glProgram *program, int idx)
{
    const MOJOSHADER_parseData *pd = program->vertex->parseData;
    const MOJOSHADER_attribute *a = pd->attributes;

    if (ctx->have_opengl_2)
    {
        return ctx->glGetAttribLocation(program->handle,
                                        (const GLchar *) a[idx].name);
    } // if

    return ctx->glGetAttribLocationARB((GLhandleARB) program->handle,
                                        (const GLcharARB *) a[idx].name);
}